

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O3

void __thiscall
cpp_client::Any::
holder2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~holder2
          (holder2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  pointer pcVar1;
  
  (this->super_holder)._vptr_holder = (_func_int **)&PTR__holder2_001392a0;
  pcVar1 = (this->obj_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->obj_).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~holder2() noexcept override = default;